

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::ValidateExtensionRangeOptions
          (DescriptorBuilder *this,DescriptorProto *proto,Descriptor *message)

{
  char *pcVar1;
  ExtensionRangeOptions *pEVar2;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  ExtensionRange *pEVar3;
  RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange> *this_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>_>
  *pVVar4;
  int i_1;
  size_t n;
  ulong uVar5;
  int i;
  int iVar6;
  string_view element_name;
  string_view full_name;
  string_view element_name_00;
  int64_t *local_80;
  int64_t max_extension_range;
  VoidPtr local_70;
  code *pcStack_68;
  VoidPtr local_60;
  code *pcStack_58;
  flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  declaration_full_name_set;
  
  max_extension_range = 0x1fffffff;
  if ((message->options_->field_0)._impl_.message_set_wire_format_ != false) {
    max_extension_range = 0x7fffffff;
  }
  n = 0;
  for (iVar6 = 0; iVar6 < message->extension_range_count_; iVar6 = iVar6 + 1) {
    pEVar3 = Descriptor::extension_range(message,iVar6);
    if (pEVar3->options_ != (ExtensionRangeOptions *)0x0) {
      pEVar3 = Descriptor::extension_range(message,iVar6);
      n = n + (long)*(int *)((long)&pEVar3->options_->field_0 + 0x28);
    }
  }
  declaration_full_name_set.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       1;
  declaration_full_name_set.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::reserve(&declaration_full_name_set.
             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ,n);
  this_00 = &(proto->field_0)._impl_.extension_range_;
  iVar6 = 0;
  do {
    if (message->extension_range_count_ <= iVar6) {
LAB_001400fe:
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::~raw_hash_set(&declaration_full_name_set.
                       super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     );
      return;
    }
    pEVar3 = Descriptor::extension_range(message,iVar6);
    if (max_extension_range + 1 < (long)pEVar3->end_) {
      pcVar1 = (message->all_names_).payload_;
      element_name._M_len = (ulong)*(ushort *)(pcVar1 + 2);
      element_name._M_str = pcVar1 + ~element_name._M_len;
      local_80 = &max_extension_range;
      pcStack_58 = absl::lts_20250127::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::ValidateExtensionRangeOptions(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const&)::__0,std::__cxx11::string>
      ;
      local_60.obj = &local_80;
      make_error.invoker_ =
           absl::lts_20250127::functional_internal::
           InvokeObject<google::protobuf::DescriptorBuilder::ValidateExtensionRangeOptions(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const&)::__0,std::__cxx11::string>
      ;
      make_error.ptr_.obj = local_60.obj;
      AddError(this,element_name,&proto->super_Message,NUMBER,make_error);
    }
    pEVar2 = pEVar3->options_;
    if (*(int *)((long)&pEVar2->field_0 + 0x28) != 0) {
      if (((*(byte *)((long)&pEVar2->field_0 + 0x18) & 2) != 0) &&
         ((pEVar2->field_0)._impl_.verification_ == 1)) {
        pcVar1 = (message->all_names_).payload_;
        uVar5 = (ulong)*(ushort *)(pcVar1 + 2);
        pVVar4 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                           (&this_00->super_RepeatedPtrFieldBase,iVar6);
        pcStack_68 = absl::lts_20250127::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::ValidateExtensionRangeOptions(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const&)::__1,std::__cxx11::string>
        ;
        local_70.obj = &local_80;
        make_error_00.invoker_ =
             absl::lts_20250127::functional_internal::
             InvokeObject<google::protobuf::DescriptorBuilder::ValidateExtensionRangeOptions(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const&)::__1,std::__cxx11::string>
        ;
        make_error_00.ptr_.obj = local_70.obj;
        element_name_00._M_str = pcVar1 + ~uVar5;
        element_name_00._M_len = uVar5;
        AddError(this,element_name_00,&pVVar4->super_Message,EXTENDEE,make_error_00);
        goto LAB_001400fe;
      }
      pcVar1 = (message->all_names_).payload_;
      uVar5 = (ulong)*(ushort *)(pcVar1 + 2);
      pVVar4 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                         (&this_00->super_RepeatedPtrFieldBase,iVar6);
      full_name._M_str = pcVar1 + ~uVar5;
      full_name._M_len = uVar5;
      ValidateExtensionDeclaration
                (this,full_name,&(pEVar2->field_0)._impl_.declaration_,pVVar4,
                 &declaration_full_name_set);
    }
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

void DescriptorBuilder::ValidateExtensionRangeOptions(
    const DescriptorProto& proto, const Descriptor& message) {
  const int64_t max_extension_range =
      static_cast<int64_t>(message.options().message_set_wire_format()
                               ? std::numeric_limits<int32_t>::max()
                               : FieldDescriptor::kMaxNumber);

  size_t num_declarations = 0;
  for (int i = 0; i < message.extension_range_count(); i++) {
    if (message.extension_range(i)->options_ == nullptr) continue;
    num_declarations +=
        message.extension_range(i)->options_->declaration_size();
  }

  // Contains the full names from both "declaration" and "metadata".
  absl::flat_hash_set<absl::string_view> declaration_full_name_set;
  declaration_full_name_set.reserve(num_declarations);

  for (int i = 0; i < message.extension_range_count(); i++) {
    const auto& range = *message.extension_range(i);
    if (range.end_number() > max_extension_range + 1) {
      AddError(message.full_name(), proto,
               DescriptorPool::ErrorCollector::NUMBER, [&] {
                 return absl::Substitute(
                     "Extension numbers cannot be greater than $0.",
                     max_extension_range);
               });
    }
    const auto& range_options = *range.options_;


    if (!range_options.declaration().empty()) {
      // TODO: remove the "has_verification" check once the default
      // is flipped to DECLARATION.
      if (range_options.has_verification() &&
          range_options.verification() == ExtensionRangeOptions::UNVERIFIED) {
        AddError(message.full_name(), proto.extension_range(i),
                 DescriptorPool::ErrorCollector::EXTENDEE, [&] {
                   return "Cannot mark the extension range as UNVERIFIED when "
                          "it has extension(s) declared.";
                 });
        return;
      }
      ValidateExtensionDeclaration(
          message.full_name(), range_options.declaration(),
          proto.extension_range(i), declaration_full_name_set);
    }
  }
}